

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

aiScene * __thiscall Assimp::Importer::ReadFile(Importer *this,char *_pFile,uint pFlags)

{
  pointer ppBVar1;
  IOSystem *pIVar2;
  ProgressHandler *pPVar3;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_> uVar4;
  int iVar5;
  Logger *pLVar6;
  ImporterPimpl *pIVar7;
  __uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
  this_00;
  long lVar8;
  long *plVar9;
  ulong uVar10;
  undefined4 extraout_var_00;
  aiScene *paVar11;
  BaseImporter *pBVar12;
  uint uVar13;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  profiler;
  ValidateDSProcess ds;
  allocator local_89;
  string ext;
  string pFile;
  ScenePreprocessor pre;
  undefined4 extraout_var;
  
  std::__cxx11::string::string((string *)&pFile,_pFile,(allocator *)&ext);
  WriteLogOpening(&pFile);
  pIVar7 = this->pimpl;
  if (pIVar7->mScene != (aiScene *)0x0) {
    pLVar6 = DefaultLogger::get();
    Logger::debug(pLVar6,"(Deleting previous scene)");
    FreeScene(this);
    pIVar7 = this->pimpl;
  }
  iVar5 = (*pIVar7->mIOHandler->_vptr_IOSystem[2])(pIVar7->mIOHandler,pFile._M_dataplus._M_p);
  if ((char)iVar5 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ds,
                   "Unable to open file \"",&pFile);
    std::operator+(&ext,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ds,
                   "\".");
    std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,(string *)&ext);
    std::__cxx11::string::~string((string *)&ext);
    std::__cxx11::string::~string((string *)&ds);
    pLVar6 = DefaultLogger::get();
    Logger::error(pLVar6,&this->pimpl->mErrorString);
    goto LAB_0012a486;
  }
  iVar5 = GetPropertyInteger(this,"GLOB_MEASURE_TIME",0);
  if (iVar5 == 0) {
    profiler._M_t.
    super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ._M_t.
    super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
    .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
         (__uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
          )(__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            )0x0;
  }
  else {
    this_00.
    super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ._M_t.
    super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
    .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
         (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
          )operator_new(0x30);
    (((_Rb_tree_header *)
     ((long)this_00.
            super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            ._M_t.
            super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
            .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 8))->
    _M_header)._M_color = _S_red;
    *(_Base_ptr *)
     ((long)this_00.
            super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            ._M_t.
            super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
            .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x10) =
         (_Base_ptr)0x0;
    *(_Base_ptr *)
     ((long)this_00.
            super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            ._M_t.
            super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
            .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x18) =
         (_Base_ptr)
         ((long)this_00.
                super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 8);
    *(_Base_ptr *)
     ((long)this_00.
            super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            ._M_t.
            super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
            .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x20) =
         (_Base_ptr)
         ((long)this_00.
                super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 8);
    *(size_t *)
     ((long)this_00.
            super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
            ._M_t.
            super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
            .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl + 0x28) = 0;
    profiler._M_t.
    super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ._M_t.
    super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
    .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
         (__uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
          )(__uniq_ptr_data<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>,_true,_true>
            )this_00.
             super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
             .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&ext,"total",(allocator *)&ds);
    Profiling::Profiler::BeginRegion
              ((Profiler *)
               this_00.
               super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,&ext);
    std::__cxx11::string::~string((string *)&ext);
  }
  SetPropertyInteger(this,"importerIndex",-1);
  uVar13 = 0;
  while( true ) {
    uVar10 = (ulong)uVar13;
    pIVar7 = this->pimpl;
    ppBVar1 = (pIVar7->mImporter).
              super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pIVar7->mImporter).
                      super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <= uVar10)
    break;
    pBVar12 = ppBVar1[uVar10];
    iVar5 = (*pBVar12->_vptr_BaseImporter[3])(pBVar12,&pFile,pIVar7->mIOHandler,0);
    if ((char)iVar5 != '\0') {
      pBVar12 = (this->pimpl->mImporter).
                super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar10];
      SetPropertyInteger(this,"importerIndex",uVar13);
      if (pBVar12 != (BaseImporter *)0x0) goto LAB_0012a3b2;
      break;
    }
    uVar13 = uVar13 + 1;
  }
  lVar8 = std::__cxx11::string::rfind((char)&pFile,0x2e);
  if (lVar8 != -1) {
    pLVar6 = DefaultLogger::get();
    Logger::info(pLVar6,"File extension not known, trying signature-based detection");
    uVar13 = 0;
    while( true ) {
      uVar10 = (ulong)uVar13;
      pIVar7 = this->pimpl;
      ppBVar1 = (pIVar7->mImporter).
                super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pIVar7->mImporter).
                        super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <= uVar10)
      break;
      pBVar12 = ppBVar1[uVar10];
      iVar5 = (*pBVar12->_vptr_BaseImporter[3])(pBVar12,&pFile,pIVar7->mIOHandler,1);
      if ((char)iVar5 != '\0') {
        pBVar12 = (this->pimpl->mImporter).
                  super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar10];
        SetPropertyInteger(this,"importerIndex",uVar13);
        if (pBVar12 != (BaseImporter *)0x0) goto LAB_0012a3b2;
        break;
      }
      uVar13 = uVar13 + 1;
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ds,
                 "No suitable reader found for the file format of file \"",&pFile);
  std::operator+(&ext,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ds,"\"."
                );
  std::__cxx11::string::operator=((string *)&this->pimpl->mErrorString,(string *)&ext);
  std::__cxx11::string::~string((string *)&ext);
  std::__cxx11::string::~string((string *)&ds);
  pLVar6 = DefaultLogger::get();
  Logger::error(pLVar6,&this->pimpl->mErrorString);
LAB_0012a47e:
  std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>::
  ~unique_ptr(&profiler);
LAB_0012a486:
  std::__cxx11::string::~string((string *)&pFile);
  return (aiScene *)0x0;
LAB_0012a3b2:
  pIVar2 = this->pimpl->mIOHandler;
  std::__cxx11::string::string((string *)&ext,"rb",(allocator *)&ds);
  iVar5 = (*pIVar2->_vptr_IOSystem[4])(pIVar2,pFile._M_dataplus._M_p,ext._M_dataplus._M_p);
  plVar9 = (long *)CONCAT44(extraout_var,iVar5);
  std::__cxx11::string::~string((string *)&ext);
  if (plVar9 == (long *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = (**(code **)(*plVar9 + 0x30))(plVar9);
    pIVar2 = this->pimpl->mIOHandler;
    (*pIVar2->_vptr_IOSystem[5])(pIVar2,plVar9);
  }
  iVar5 = (*pBVar12->_vptr_BaseImporter[5])(pBVar12);
  std::__cxx11::string::string((string *)&ext,"unknown",(allocator *)&ds);
  if (CONCAT44(extraout_var_00,iVar5) != 0) {
    std::__cxx11::string::assign((char *)&ext);
  }
  pLVar6 = DefaultLogger::get();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pre,
                 "Found a matching importer for this file format: ",&ext);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ds,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pre,".");
  Logger::info(pLVar6,(char *)ds.super_BaseProcess._vptr_BaseProcess);
  std::__cxx11::string::~string((string *)&ds);
  std::__cxx11::string::~string((string *)&pre);
  pPVar3 = this->pimpl->mProgressHandler;
  (*pPVar3->_vptr_ProgressHandler[3])(pPVar3,0,uVar10 & 0xffffffff);
  uVar4 = profiler;
  if ((__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )profiler._M_t.
        super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
        .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )0x0) {
    std::__cxx11::string::string((string *)&ds,"import",(allocator *)&pre);
    Profiling::Profiler::BeginRegion
              ((Profiler *)
               uVar4._M_t.
               super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
               (string *)&ds);
    std::__cxx11::string::~string((string *)&ds);
  }
  paVar11 = BaseImporter::ReadFile(pBVar12,this,&pFile,this->pimpl->mIOHandler);
  this->pimpl->mScene = paVar11;
  pPVar3 = this->pimpl->mProgressHandler;
  (*pPVar3->_vptr_ProgressHandler[3])(pPVar3,uVar10 & 0xffffffff,uVar10 & 0xffffffff);
  uVar4 = profiler;
  if ((__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )profiler._M_t.
        super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
        .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )0x0) {
    std::__cxx11::string::string((string *)&ds,"import",(allocator *)&pre);
    Profiling::Profiler::EndRegion
              ((Profiler *)
               uVar4._M_t.
               super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
               (string *)&ds);
    std::__cxx11::string::~string((string *)&ds);
  }
  SetPropertyString(this,"sourceFilePath",&pFile);
  if (this->pimpl->mScene == (aiScene *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->pimpl->mErrorString);
    goto LAB_0012a6d8;
  }
  if ((pFlags >> 10 & 1) != 0) {
    ValidateDSProcess::ValidateDSProcess(&ds);
    BaseProcess::ExecuteOnScene(&ds.super_BaseProcess,this);
    paVar11 = this->pimpl->mScene;
    ValidateDSProcess::~ValidateDSProcess(&ds);
    if (paVar11 == (aiScene *)0x0) {
      std::__cxx11::string::~string((string *)&ext);
      goto LAB_0012a47e;
    }
  }
  uVar4._M_t.
  super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
  .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
       profiler._M_t.
       super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       ._M_t.
       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )profiler._M_t.
        super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
        .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )0x0) {
    std::__cxx11::string::string((string *)&ds,"preprocess",(allocator *)&pre);
    Profiling::Profiler::BeginRegion
              ((Profiler *)
               uVar4._M_t.
               super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
               (string *)&ds);
    std::__cxx11::string::~string((string *)&ds);
  }
  pre.scene = this->pimpl->mScene;
  ScenePreprocessor::ProcessScene(&pre);
  uVar4 = profiler;
  if ((__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )profiler._M_t.
        super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
        .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )0x0) {
    std::__cxx11::string::string((string *)&ds,"preprocess",&local_89);
    Profiling::Profiler::EndRegion
              ((Profiler *)
               uVar4._M_t.
               super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
               (string *)&ds);
    std::__cxx11::string::~string((string *)&ds);
  }
  ApplyPostProcessing(this,pFlags & 0xfffffbff);
LAB_0012a6d8:
  SharedPostProcessInfo::Clean(this->pimpl->mPPShared);
  uVar4 = profiler;
  if ((__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )profiler._M_t.
        super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
        .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
       )0x0) {
    std::__cxx11::string::string((string *)&ds,"total",(allocator *)&pre);
    Profiling::Profiler::EndRegion
              ((Profiler *)
               uVar4._M_t.
               super___uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
               (string *)&ds);
    std::__cxx11::string::~string((string *)&ds);
  }
  std::__cxx11::string::~string((string *)&ext);
  std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>::
  ~unique_ptr(&profiler);
  std::__cxx11::string::~string((string *)&pFile);
  return this->pimpl->mScene;
}

Assistant:

const aiScene* Importer::ReadFile( const char* _pFile, unsigned int pFlags)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
    const std::string pFile(_pFile);

    // ----------------------------------------------------------------------
    // Put a large try block around everything to catch all std::exception's
    // that might be thrown by STL containers or by new().
    // ImportErrorException's are throw by ourselves and caught elsewhere.
    //-----------------------------------------------------------------------

    WriteLogOpening(pFile);

#ifdef ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    try
#endif // ! ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    {
        // Check whether this Importer instance has already loaded
        // a scene. In this case we need to delete the old one
        if (pimpl->mScene)  {

            ASSIMP_LOG_DEBUG("(Deleting previous scene)");
            FreeScene();
        }

        // First check if the file is accessible at all
        if( !pimpl->mIOHandler->Exists( pFile)) {

            pimpl->mErrorString = "Unable to open file \"" + pFile + "\".";
            ASSIMP_LOG_ERROR(pimpl->mErrorString);
            return NULL;
        }

        std::unique_ptr<Profiler> profiler(GetPropertyInteger(AI_CONFIG_GLOB_MEASURE_TIME,0)?new Profiler():NULL);
        if (profiler) {
            profiler->BeginRegion("total");
        }

        // Find an worker class which can handle the file
        BaseImporter* imp = NULL;
        SetPropertyInteger("importerIndex", -1);
        for( unsigned int a = 0; a < pimpl->mImporter.size(); a++)  {

            if( pimpl->mImporter[a]->CanRead( pFile, pimpl->mIOHandler, false)) {
                imp = pimpl->mImporter[a];
                SetPropertyInteger("importerIndex", a);
                break;
            }
        }

        if (!imp)   {
            // not so bad yet ... try format auto detection.
            const std::string::size_type s = pFile.find_last_of('.');
            if (s != std::string::npos) {
                ASSIMP_LOG_INFO("File extension not known, trying signature-based detection");
                for( unsigned int a = 0; a < pimpl->mImporter.size(); a++)  {
                    if( pimpl->mImporter[a]->CanRead( pFile, pimpl->mIOHandler, true)) {
                        imp = pimpl->mImporter[a];
                        SetPropertyInteger("importerIndex", a);
                        break;
                    }
                }
            }
            // Put a proper error message if no suitable importer was found
            if( !imp)   {
                pimpl->mErrorString = "No suitable reader found for the file format of file \"" + pFile + "\".";
                ASSIMP_LOG_ERROR(pimpl->mErrorString);
                return NULL;
            }
        }

        // Get file size for progress handler
        IOStream * fileIO = pimpl->mIOHandler->Open( pFile );
        uint32_t fileSize = 0;
        if (fileIO)
        {
            fileSize = static_cast<uint32_t>(fileIO->FileSize());
            pimpl->mIOHandler->Close( fileIO );
        }

        // Dispatch the reading to the worker class for this format
        const aiImporterDesc *desc( imp->GetInfo() );
        std::string ext( "unknown" );
        if ( NULL != desc ) {
            ext = desc->mName;
        }
        ASSIMP_LOG_INFO("Found a matching importer for this file format: " + ext + "." );
        pimpl->mProgressHandler->UpdateFileRead( 0, fileSize );

        if (profiler) {
            profiler->BeginRegion("import");
        }

        pimpl->mScene = imp->ReadFile( this, pFile, pimpl->mIOHandler);
        pimpl->mProgressHandler->UpdateFileRead( fileSize, fileSize );

        if (profiler) {
            profiler->EndRegion("import");
        }

        SetPropertyString("sourceFilePath", pFile);

        // If successful, apply all active post processing steps to the imported data
        if( pimpl->mScene)  {

#ifndef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
            // The ValidateDS process is an exception. It is executed first, even before ScenePreprocessor is called.
            if (pFlags & aiProcess_ValidateDataStructure)
            {
                ValidateDSProcess ds;
                ds.ExecuteOnScene (this);
                if (!pimpl->mScene) {
                    return NULL;
                }
            }
#endif // no validation

            // Preprocess the scene and prepare it for post-processing
            if (profiler) {
                profiler->BeginRegion("preprocess");
            }

            ScenePreprocessor pre(pimpl->mScene);
            pre.ProcessScene();

            if (profiler) {
                profiler->EndRegion("preprocess");
            }

            // Ensure that the validation process won't be called twice
            ApplyPostProcessing(pFlags & (~aiProcess_ValidateDataStructure));
        }
        // if failed, extract the error string
        else if( !pimpl->mScene) {
            pimpl->mErrorString = imp->GetErrorText();
        }

        // clear any data allocated by post-process steps
        pimpl->mPPShared->Clean();

        if (profiler) {
            profiler->EndRegion("total");
        }
    }
#ifdef ASSIMP_CATCH_GLOBAL_EXCEPTIONS
    catch (std::exception &e)
    {
#if (defined _MSC_VER) &&   (defined _CPPRTTI)
        // if we have RTTI get the full name of the exception that occurred
        pimpl->mErrorString = std::string(typeid( e ).name()) + ": " + e.what();
#else
        pimpl->mErrorString = std::string("std::exception: ") + e.what();
#endif

        ASSIMP_LOG_ERROR(pimpl->mErrorString);
        delete pimpl->mScene; pimpl->mScene = NULL;
    }
#endif // ! ASSIMP_CATCH_GLOBAL_EXCEPTIONS

    // either successful or failure - the pointer expresses it anyways
    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    return pimpl->mScene;
}